

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O2

string * google::protobuf::compiler::objectivec::BuildFlagsString
                   (string *__return_storage_ptr__,FlagType flag_type,
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *strings)

{
  pointer pbVar1;
  LogMessage *pLVar2;
  long lVar3;
  char *pcVar4;
  size_t i;
  LogFinisher local_a1;
  LogMessage local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  pbVar1 = (strings->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar3 = (long)(strings->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5;
  if (lVar3 == 1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)pbVar1);
    return __return_storage_ptr__;
  }
  if (lVar3 == 0) {
    if (flag_type == FLAGTYPE_FIELD) {
      pcVar4 = "GPBFieldNone";
    }
    else if (flag_type == FLAGTYPE_EXTENSION) {
      pcVar4 = "GPBExtensionNone";
    }
    else if (flag_type == FLAGTYPE_DESCRIPTOR_INITIALIZATION) {
      pcVar4 = "GPBDescriptorInitializationFlag_None";
    }
    else {
      internal::LogMessage::LogMessage
                (&local_a0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/objectivec/objectivec_helpers.cc"
                 ,0x116);
      pLVar2 = internal::LogMessage::operator<<(&local_a0,"Can\'t get here.");
      internal::LogFinisher::operator=((LogFinisher *)&local_48,pLVar2);
      internal::LogMessage::~LogMessage(&local_a0);
      pcVar4 = "0";
    }
    std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar4,(allocator *)&local_a0);
    return __return_storage_ptr__;
  }
  if (flag_type == FLAGTYPE_FIELD) {
    pcVar4 = "GPBFieldFlags";
  }
  else if (flag_type == FLAGTYPE_EXTENSION) {
    pcVar4 = "GPBExtensionOptions";
  }
  else {
    if (flag_type != FLAGTYPE_DESCRIPTOR_INITIALIZATION) {
      internal::LogMessage::LogMessage
                (&local_a0,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/objectivec/objectivec_helpers.cc"
                 ,0x124);
      pLVar2 = internal::LogMessage::operator<<(&local_a0,"Can\'t get here.");
      internal::LogFinisher::operator=(&local_a1,pLVar2);
      internal::LogMessage::~LogMessage(&local_a0);
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      local_68._M_string_length = 0;
      local_68.field_2._M_local_buf[0] = '\0';
      goto LAB_0025feab;
    }
    pcVar4 = "GPBDescriptorInitializationFlags";
  }
  std::__cxx11::string::string((string *)&local_68,pcVar4,(allocator *)&local_a0);
LAB_0025feab:
  std::operator+(&local_48,"(",&local_68);
  std::operator+(__return_storage_ptr__,&local_48,")(");
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  for (lVar3 = 0;
      lVar3 != (long)(strings->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish -
               (long)(strings->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start >> 5; lVar3 = lVar3 + 1) {
    if (lVar3 != 0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    std::__cxx11::string::append((string *)__return_storage_ptr__);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string BuildFlagsString(const FlagType flag_type,
                        const vector<string>& strings) {
  if (strings.size() == 0) {
    return GetZeroEnumNameForFlagType(flag_type);
  } else if (strings.size() == 1) {
    return strings[0];
  }
  string string("(" + GetEnumNameForFlagType(flag_type) + ")(");
  for (size_t i = 0; i != strings.size(); ++i) {
    if (i > 0) {
      string.append(" | ");
    }
    string.append(strings[i]);
  }
  string.append(")");
  return string;
}